

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O3

void CMU462::Collada::ColladaParser::parse_node(XMLElement *xml)

{
  char cVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  char *pcVar6;
  XMLElement *pXVar7;
  XMLElement *pXVar8;
  XMLElement *xml_00;
  XMLElement *xml_01;
  LightInfo *pLVar9;
  size_t sVar10;
  MaterialInfo *pMVar11;
  long lVar12;
  int i;
  string *psVar13;
  Matrix4x4 *pMVar14;
  Matrix4x4 *pMVar15;
  stringstream *psVar16;
  Matrix4x4 *pMVar17;
  double *pdVar18;
  undefined8 *puVar19;
  byte bVar20;
  string s_1;
  Matrix4x4 mat;
  string sid;
  string name;
  Node node;
  string s;
  Matrix4x4 transform_save;
  long *local_530 [2];
  long local_520 [2];
  int local_50c;
  Matrix4x4 local_508;
  long *local_488;
  long local_480;
  long local_478 [2];
  long *local_468 [2];
  long local_458 [2];
  XMLElement *local_448;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  Node local_300;
  long *local_238 [2];
  long local_228 [12];
  undefined8 auStack_1c8 [2];
  stringstream local_1b8 [8];
  undefined8 auStack_1b0 [15];
  ios_base local_138 [264];
  
  bVar20 = 0;
  Node::Node(&local_300);
  pcVar6 = tinyxml2::XMLElement::Attribute(xml,"id",(char *)0x0);
  strlen(pcVar6);
  std::__cxx11::string::_M_replace
            ((ulong)&local_300,0,(char *)local_300.id._M_string_length,(ulong)pcVar6);
  pcVar6 = tinyxml2::XMLElement::Attribute(xml,"name",(char *)0x0);
  strlen(pcVar6);
  std::__cxx11::string::_M_replace
            ((ulong)&local_300.name,0,(char *)local_300.name._M_string_length,(ulong)pcVar6);
  local_448 = xml;
  pXVar7 = tinyxml2::XMLNode::FirstChildElement(&xml->super_XMLNode,(char *)0x0);
  do {
    if (pXVar7 == (XMLElement *)0x0) break;
    pcVar6 = tinyxml2::XMLNode::Value(&pXVar7->super_XMLNode);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_468,pcVar6,(allocator<char> *)local_1b8);
    local_50c = std::__cxx11::string::compare((char *)local_468);
    if (local_50c == 0) {
      pcVar6 = tinyxml2::XMLElement::GetText(pXVar7);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_238,pcVar6,(allocator<char> *)local_1b8);
      std::__cxx11::stringstream::stringstream(local_1b8,(string *)local_238,_S_out|_S_in);
      local_508.entries[3].z = 0.0;
      local_508.entries[3].w = 0.0;
      local_508.entries[3].x = 0.0;
      local_508.entries[3].y = 0.0;
      local_508.entries[2].z = 0.0;
      local_508.entries[2].w = 0.0;
      local_508.entries[2].x = 0.0;
      local_508.entries[2].y = 0.0;
      local_508.entries[1].z = 0.0;
      local_508.entries[1].w = 0.0;
      local_508.entries[1].x = 0.0;
      local_508.entries[1].y = 0.0;
      local_508.entries[0].z = 0.0;
      local_508.entries[0].w = 0.0;
      local_508.entries[0].x = 0.0;
      local_508.entries[0].y = 0.0;
      Matrix4x4::operator()(&local_508,0,0);
      std::istream::_M_extract<double>((double *)local_1b8);
      Matrix4x4::operator()(&local_508,0,1);
      std::istream::_M_extract<double>((double *)local_1b8);
      Matrix4x4::operator()(&local_508,0,2);
      std::istream::_M_extract<double>((double *)local_1b8);
      Matrix4x4::operator()(&local_508,0,3);
      std::istream::_M_extract<double>((double *)local_1b8);
      Matrix4x4::operator()(&local_508,1,0);
      std::istream::_M_extract<double>((double *)local_1b8);
      Matrix4x4::operator()(&local_508,1,1);
      std::istream::_M_extract<double>((double *)local_1b8);
      Matrix4x4::operator()(&local_508,1,2);
      std::istream::_M_extract<double>((double *)local_1b8);
      Matrix4x4::operator()(&local_508,1,3);
      std::istream::_M_extract<double>((double *)local_1b8);
      Matrix4x4::operator()(&local_508,2,0);
      std::istream::_M_extract<double>((double *)local_1b8);
      Matrix4x4::operator()(&local_508,2,1);
      std::istream::_M_extract<double>((double *)local_1b8);
      Matrix4x4::operator()(&local_508,2,2);
      std::istream::_M_extract<double>((double *)local_1b8);
      Matrix4x4::operator()(&local_508,2,3);
      std::istream::_M_extract<double>((double *)local_1b8);
      Matrix4x4::operator()(&local_508,3,0);
      std::istream::_M_extract<double>((double *)local_1b8);
      Matrix4x4::operator()(&local_508,3,1);
      std::istream::_M_extract<double>((double *)local_1b8);
      Matrix4x4::operator()(&local_508,3,2);
      std::istream::_M_extract<double>((double *)local_1b8);
      Matrix4x4::operator()(&local_508,3,3);
      std::istream::_M_extract<double>((double *)local_1b8);
      pMVar15 = &local_508;
      pMVar14 = &local_300.transform;
      for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
        pMVar14->entries[0].x = pMVar15->entries[0].x;
        pMVar15 = (Matrix4x4 *)((long)pMVar15 + ((ulong)bVar20 * -2 + 1) * 8);
        pMVar14 = (Matrix4x4 *)((long)pMVar14 + ((ulong)bVar20 * -2 + 1) * 8);
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      if (local_238[0] != local_228) {
        operator_delete(local_238[0],local_228[0] + 1);
      }
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)local_468);
      if (iVar5 == 0) {
        local_508.entries[3].z = 0.0;
        local_508.entries[3].w = 0.0;
        local_508.entries[3].x = 0.0;
        local_508.entries[3].y = 0.0;
        local_508.entries[2].z = 0.0;
        local_508.entries[2].w = 0.0;
        local_508.entries[2].x = 0.0;
        local_508.entries[2].y = 0.0;
        local_508.entries[1].z = 0.0;
        local_508.entries[1].w = 0.0;
        local_508.entries[1].x = 0.0;
        local_508.entries[1].y = 0.0;
        local_508.entries[0].z = 0.0;
        local_508.entries[0].w = 0.0;
        local_508.entries[0].x = 0.0;
        local_508.entries[0].y = 0.0;
        pcVar6 = tinyxml2::XMLElement::GetText(pXVar7);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_530,pcVar6,(allocator<char> *)local_1b8);
        std::__cxx11::stringstream::stringstream(local_1b8,(string *)local_530,_S_out|_S_in);
        pcVar6 = tinyxml2::XMLElement::Attribute(pXVar7,"sid",(char *)0x0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_488,pcVar6,(allocator<char> *)local_238);
        cVar1 = *(char *)((long)local_488 + local_480 + -1);
        if (cVar1 == 'X') {
          Matrix4x4::operator()(&local_508,1,1);
          std::istream::_M_extract<double>((double *)local_1b8);
          Matrix4x4::operator()(&local_508,1,2);
          std::istream::_M_extract<double>((double *)local_1b8);
          iVar5 = 1;
          i = 2;
LAB_001656af:
          Matrix4x4::operator()(&local_508,i,iVar5);
          iVar5 = 2;
          std::istream::_M_extract<double>((double *)local_1b8);
LAB_001656c7:
          Matrix4x4::operator()(&local_508,iVar5,iVar5);
          std::istream::_M_extract<double>((double *)local_1b8);
        }
        else {
          if (cVar1 == 'Y') {
            Matrix4x4::operator()(&local_508,0,0);
            std::istream::_M_extract<double>((double *)local_1b8);
            Matrix4x4::operator()(&local_508,2,0);
            std::istream::_M_extract<double>((double *)local_1b8);
            iVar5 = 2;
            i = 0;
            goto LAB_001656af;
          }
          if (cVar1 == 'Z') {
            Matrix4x4::operator()(&local_508,0,0);
            std::istream::_M_extract<double>((double *)local_1b8);
            Matrix4x4::operator()(&local_508,0,1);
            std::istream::_M_extract<double>((double *)local_1b8);
            Matrix4x4::operator()(&local_508,1,0);
            iVar5 = 1;
            std::istream::_M_extract<double>((double *)local_1b8);
            goto LAB_001656c7;
          }
        }
        Matrix4x4::operator*((Matrix4x4 *)local_238,&local_508,&local_300.transform);
        psVar13 = (string *)local_238;
        pMVar15 = &local_300.transform;
        for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
          pMVar15->entries[0].x = *(double *)psVar13;
          psVar13 = psVar13 + (ulong)bVar20 * -0x10 + 8;
          pMVar15 = (Matrix4x4 *)((long)pMVar15 + ((ulong)bVar20 * -2 + 1) * 8);
        }
        if (local_488 != local_478) {
          operator_delete(local_488,local_478[0] + 1);
        }
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_138);
        if (local_530[0] != local_520) {
          operator_delete(local_530[0],local_520[0] + 1);
        }
      }
      iVar5 = std::__cxx11::string::compare((char *)local_468);
      if (iVar5 == 0) {
        local_508.entries[3].z = 0.0;
        local_508.entries[3].w = 0.0;
        local_508.entries[3].x = 0.0;
        local_508.entries[3].y = 0.0;
        local_508.entries[2].z = 0.0;
        local_508.entries[2].w = 0.0;
        local_508.entries[2].x = 0.0;
        local_508.entries[2].y = 0.0;
        local_508.entries[1].z = 0.0;
        local_508.entries[1].w = 0.0;
        local_508.entries[1].x = 0.0;
        local_508.entries[1].y = 0.0;
        local_508.entries[0].z = 0.0;
        local_508.entries[0].w = 0.0;
        local_508.entries[0].x = 0.0;
        local_508.entries[0].y = 0.0;
        pcVar6 = tinyxml2::XMLElement::GetText(pXVar7);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_530,pcVar6,(allocator<char> *)local_1b8);
        std::__cxx11::stringstream::stringstream(local_1b8,(string *)local_530,_S_out|_S_in);
        Matrix4x4::operator()(&local_508,0,3);
        std::istream::_M_extract<double>((double *)local_1b8);
        Matrix4x4::operator()(&local_508,1,3);
        std::istream::_M_extract<double>((double *)local_1b8);
        Matrix4x4::operator()(&local_508,2,3);
        std::istream::_M_extract<double>((double *)local_1b8);
        Matrix4x4::operator*((Matrix4x4 *)local_238,&local_508,&local_300.transform);
        psVar13 = (string *)local_238;
        pMVar15 = &local_300.transform;
        for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
          pMVar15->entries[0].x = *(double *)psVar13;
          psVar13 = psVar13 + (ulong)bVar20 * -0x10 + 8;
          pMVar15 = (Matrix4x4 *)((long)pMVar15 + ((ulong)bVar20 * -2 + 1) * 8);
        }
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_138);
        if (local_530[0] != local_520) {
          operator_delete(local_530[0],local_520[0] + 1);
        }
      }
      iVar5 = std::__cxx11::string::compare((char *)local_468);
      if (iVar5 == 0) {
        local_508.entries[3].z = 0.0;
        local_508.entries[3].w = 0.0;
        local_508.entries[3].x = 0.0;
        local_508.entries[3].y = 0.0;
        local_508.entries[2].z = 0.0;
        local_508.entries[2].w = 0.0;
        local_508.entries[2].x = 0.0;
        local_508.entries[2].y = 0.0;
        local_508.entries[1].z = 0.0;
        local_508.entries[1].w = 0.0;
        local_508.entries[1].x = 0.0;
        local_508.entries[1].y = 0.0;
        local_508.entries[0].z = 0.0;
        local_508.entries[0].w = 0.0;
        local_508.entries[0].x = 0.0;
        local_508.entries[0].y = 0.0;
        pcVar6 = tinyxml2::XMLElement::GetText(pXVar7);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_530,pcVar6,(allocator<char> *)local_1b8);
        std::__cxx11::stringstream::stringstream(local_1b8,(string *)local_530,_S_out|_S_in);
        Matrix4x4::operator()(&local_508,0,0);
        std::istream::_M_extract<double>((double *)local_1b8);
        Matrix4x4::operator()(&local_508,1,1);
        std::istream::_M_extract<double>((double *)local_1b8);
        Matrix4x4::operator()(&local_508,1,1);
        std::istream::_M_extract<double>((double *)local_1b8);
        Matrix4x4::operator*((Matrix4x4 *)local_238,&local_508,&local_300.transform);
        psVar13 = (string *)local_238;
        pMVar15 = &local_300.transform;
        for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
          pMVar15->entries[0].x = *(double *)psVar13;
          psVar13 = psVar13 + (ulong)bVar20 * -0x10 + 8;
          pMVar15 = (Matrix4x4 *)((long)pMVar15 + ((ulong)bVar20 * -2 + 1) * 8);
        }
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_138);
        if (local_530[0] != local_520) {
          operator_delete(local_530[0],local_520[0] + 1);
        }
      }
      pXVar7 = tinyxml2::XMLNode::NextSiblingElement(&pXVar7->super_XMLNode,(char *)0x0);
    }
    if (local_468[0] != local_458) {
      operator_delete(local_468[0],local_458[0] + 1);
    }
  } while (local_50c != 0);
  lVar12 = 0x10;
  do {
    uVar2 = *(undefined8 *)(up + lVar12 + 0x10);
    uVar3 = *(undefined8 *)((long)&transform + lVar12);
    uVar4 = *(undefined8 *)((long)&DAT_0026dcb0 + lVar12);
    *(undefined8 *)((long)auStack_1c8 + lVar12) = *(undefined8 *)(up + lVar12 + 8);
    *(undefined8 *)((long)auStack_1c8 + lVar12 + 8) = uVar2;
    *(undefined8 *)((long)auStack_1b0 + lVar12 + -8) = uVar3;
    *(undefined8 *)((long)auStack_1b0 + lVar12) = uVar4;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0x90);
  pMVar15 = &local_300.transform;
  Matrix4x4::operator*(&local_508,(Matrix4x4 *)&transform,pMVar15);
  pXVar7 = local_448;
  pMVar14 = &local_508;
  pMVar17 = pMVar15;
  for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
    pMVar17->entries[0].x = pMVar14->entries[0].x;
    pMVar14 = (Matrix4x4 *)((long)pMVar14 + ((ulong)bVar20 * -2 + 1) * 8);
    pMVar17 = (Matrix4x4 *)((long)pMVar17 + ((ulong)bVar20 * -2 + 1) * 8);
  }
  pdVar18 = (double *)&transform;
  for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
    *pdVar18 = pMVar15->entries[0].x;
    pMVar15 = (Matrix4x4 *)((long)pMVar15 + ((ulong)bVar20 * -2 + 1) * 8);
    pdVar18 = pdVar18 + (ulong)bVar20 * -2 + 1;
  }
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"node","");
  pXVar8 = get_element(pXVar7,&local_320);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  for (; pXVar8 != (XMLElement *)0x0;
      pXVar8 = tinyxml2::XMLNode::NextSiblingElement(&pXVar8->super_XMLNode,"node")) {
    parse_node(pXVar8);
  }
  psVar16 = local_1b8;
  puVar19 = &transform;
  for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
    *puVar19 = *(undefined8 *)psVar16;
    psVar16 = psVar16 + ((ulong)bVar20 * -2 + 1) * 8;
    puVar19 = puVar19 + (ulong)bVar20 * -2 + 1;
  }
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"instance_camera","");
  pXVar8 = get_element(pXVar7,&local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"instance_light","");
  xml_00 = get_element(pXVar7,&local_360);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"instance_geometry","");
  xml_01 = get_element(pXVar7,&local_380);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  if (pXVar8 == (XMLElement *)0x0) {
    if (xml_00 == (XMLElement *)0x0) {
      if (xml_01 != (XMLElement *)0x0) {
        local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"mesh","");
        pXVar8 = get_element(xml_01,&local_3a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
          operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
        }
        if (pXVar8 == (XMLElement *)0x0) {
          local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"extra","");
          pXVar8 = get_element(xml_01,&local_400);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_400._M_dataplus._M_p != &local_400.field_2) {
            operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
          }
          if (pXVar8 == (XMLElement *)0x0) goto LAB_00165c8e;
          pLVar9 = (LightInfo *)operator_new(0x58);
          *(undefined8 *)&pLVar9->super_Instance = 0;
          (pLVar9->super_Instance).id._M_dataplus._M_p = (pointer)0x0;
          (pLVar9->super_Instance).id._M_string_length = 0;
          (pLVar9->super_Instance).id.field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&(pLVar9->super_Instance).id.field_2 + 8) = 0;
          (pLVar9->super_Instance).name._M_dataplus._M_p = (pointer)0x0;
          (pLVar9->super_Instance).name._M_string_length = 0;
          (pLVar9->super_Instance).name.field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&(pLVar9->super_Instance).name.field_2 + 8) = 0;
          ((Vector3D *)&pLVar9->light_type)->x = 0.0;
          *(double *)&(pLVar9->spectrum).g = 0.0;
          (pLVar9->super_Instance).id._M_dataplus._M_p =
               (pointer)&(pLVar9->super_Instance).id.field_2;
          (pLVar9->super_Instance).id.field_2._M_local_buf[0] = '\0';
          (pLVar9->super_Instance).name._M_dataplus._M_p =
               (pointer)&(pLVar9->super_Instance).name.field_2;
          (pLVar9->super_Instance).name.field_2._M_local_buf[0] = '\0';
          parse_sphere(xml_01,(SphereInfo *)pLVar9);
          local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_420,
                     "instance_geometry/bind_material/technique_common/instance_material","");
          pXVar7 = get_element(pXVar7,&local_420);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_420._M_dataplus._M_p != &local_420.field_2) {
            operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
          }
          local_300.instance = (Instance *)pLVar9;
          if (pXVar7 == (XMLElement *)0x0) goto LAB_00165c8e;
          pcVar6 = tinyxml2::XMLElement::Attribute(pXVar7,"target",(char *)0x0);
          if (pcVar6 == (char *)0x0) goto LAB_00166163;
          pcVar6 = tinyxml2::XMLElement::Attribute(pXVar7,"target",(char *)0x0);
          local_508.entries[0].x = (double)&local_508.entries[0].z;
          sVar10 = strlen(pcVar6 + 1);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_508,pcVar6 + 1,pcVar6 + sVar10 + 1);
          local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_440,local_508.entries[0].x,
                     (long)local_508.entries[0].y + (long)local_508.entries[0].x);
          pXVar7 = uri_find(&local_440);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._M_dataplus._M_p != &local_440.field_2) {
            operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
          }
          if (pXVar7 == (XMLElement *)0x0) goto LAB_00166163;
          pMVar11 = (MaterialInfo *)operator_new(0x50);
          *(undefined8 *)&pMVar11->super_Instance = 0;
          (pMVar11->super_Instance).id._M_dataplus._M_p = (pointer)0x0;
          (pMVar11->super_Instance).id._M_string_length = 0;
          (pMVar11->super_Instance).id.field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&(pMVar11->super_Instance).id.field_2 + 8) = 0;
          (pMVar11->super_Instance).name._M_dataplus._M_p = (pointer)0x0;
          (pMVar11->super_Instance).name._M_string_length = 0;
          (pMVar11->super_Instance).name.field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&(pMVar11->super_Instance).name.field_2 + 8) = 0;
          pMVar11->bsdf = (BSDF *)0x0;
          (pMVar11->super_Instance).id._M_dataplus._M_p =
               (pointer)&(pMVar11->super_Instance).id.field_2;
          (pMVar11->super_Instance).id.field_2._M_local_buf[0] = '\0';
          (pMVar11->super_Instance).name._M_dataplus._M_p =
               (pointer)&(pMVar11->super_Instance).name.field_2;
          (pMVar11->super_Instance).name.field_2._M_local_buf[0] = '\0';
          parse_material(pXVar7,pMVar11);
          *(MaterialInfo **)&(pLVar9->spectrum).g = pMVar11;
        }
        else {
          pLVar9 = (LightInfo *)operator_new(0xb0);
          memset(pLVar9,0,0xb0);
          (pLVar9->super_Instance).id._M_dataplus._M_p =
               (pointer)&(pLVar9->super_Instance).id.field_2;
          (pLVar9->super_Instance).id.field_2._M_local_buf[0] = '\0';
          (pLVar9->super_Instance).name._M_dataplus._M_p =
               (pointer)&(pLVar9->super_Instance).name.field_2;
          (pLVar9->super_Instance).name.field_2._M_local_buf[0] = '\0';
          pLVar9->light_type = NONE;
          (pLVar9->spectrum).r = 0.0;
          (pLVar9->spectrum).g = 0.0;
          (pLVar9->spectrum).b = 0.0;
          (pLVar9->position).x = 0.0;
          (pLVar9->position).y = 0.0;
          (pLVar9->position).z = 0.0;
          (pLVar9->direction).x = 0.0;
          (pLVar9->direction).y = 0.0;
          (pLVar9->direction).z = 0.0;
          (pLVar9->up).x = 0.0;
          (pLVar9->up).y = 0.0;
          (pLVar9->up).z = 0.0;
          pLVar9->falloff_deg = 0.0;
          pLVar9->falloff_exp = 0.0;
          parse_polymesh(xml_01,(PolymeshInfo *)pLVar9);
          local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3c0,
                     "instance_geometry/bind_material/technique_common/instance_material","");
          pXVar7 = get_element(pXVar7,&local_3c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
            operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
          }
          local_300.instance = (Instance *)pLVar9;
          if (pXVar7 == (XMLElement *)0x0) goto LAB_00165c8e;
          pcVar6 = tinyxml2::XMLElement::Attribute(pXVar7,"target",(char *)0x0);
          if (pcVar6 == (char *)0x0) {
LAB_00166163:
            exit(1);
          }
          pcVar6 = tinyxml2::XMLElement::Attribute(pXVar7,"target",(char *)0x0);
          local_508.entries[0].x = (double)&local_508.entries[0].z;
          sVar10 = strlen(pcVar6 + 1);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_508,pcVar6 + 1,pcVar6 + sVar10 + 1);
          local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3e0,local_508.entries[0].x,
                     (long)local_508.entries[0].y + (long)local_508.entries[0].x);
          pXVar7 = uri_find(&local_3e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
            operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
          }
          if (pXVar7 == (XMLElement *)0x0) goto LAB_00166163;
          pMVar11 = (MaterialInfo *)operator_new(0x50);
          *(undefined8 *)&pMVar11->super_Instance = 0;
          (pMVar11->super_Instance).id._M_dataplus._M_p = (pointer)0x0;
          (pMVar11->super_Instance).id._M_string_length = 0;
          (pMVar11->super_Instance).id.field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&(pMVar11->super_Instance).id.field_2 + 8) = 0;
          (pMVar11->super_Instance).name._M_dataplus._M_p = (pointer)0x0;
          (pMVar11->super_Instance).name._M_string_length = 0;
          (pMVar11->super_Instance).name.field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&(pMVar11->super_Instance).name.field_2 + 8) = 0;
          pMVar11->bsdf = (BSDF *)0x0;
          (pMVar11->super_Instance).id._M_dataplus._M_p =
               (pointer)&(pMVar11->super_Instance).id.field_2;
          (pMVar11->super_Instance).id.field_2._M_local_buf[0] = '\0';
          (pMVar11->super_Instance).name._M_dataplus._M_p =
               (pointer)&(pMVar11->super_Instance).name.field_2;
          (pMVar11->super_Instance).name.field_2._M_local_buf[0] = '\0';
          parse_material(pXVar7,pMVar11);
          *(MaterialInfo **)&pLVar9->constant_att = pMVar11;
        }
        local_300.instance = &pLVar9->super_Instance;
        if ((double *)local_508.entries[0].x != &local_508.entries[0].z) {
          operator_delete((void *)local_508.entries[0].x,(long)local_508.entries[0].z + 1);
        }
      }
    }
    else {
      pLVar9 = (LightInfo *)operator_new(0xb8);
      LightInfo::LightInfo(pLVar9);
      parse_light(xml_00,pLVar9);
      local_300.instance = (Instance *)pLVar9;
    }
  }
  else {
    pLVar9 = (LightInfo *)operator_new(0x88);
    memset(pLVar9,0,0x88);
    (pLVar9->super_Instance).id._M_dataplus._M_p = (pointer)&(pLVar9->super_Instance).id.field_2;
    (pLVar9->super_Instance).id.field_2._M_local_buf[0] = '\0';
    (pLVar9->super_Instance).name._M_dataplus._M_p = (pointer)&(pLVar9->super_Instance).name.field_2
    ;
    (pLVar9->super_Instance).name.field_2._M_local_buf[0] = '\0';
    ((Vector3D *)&pLVar9->light_type)->x = 0.0;
    *(double *)&(pLVar9->spectrum).g = 0.0;
    (pLVar9->position).x = 0.0;
    (pLVar9->position).y = 0.0;
    (pLVar9->position).z = 0.0;
    (pLVar9->direction).x = 0.0;
    parse_camera(pXVar8,(CameraInfo *)pLVar9);
    local_300.instance = (Instance *)pLVar9;
  }
LAB_00165c8e:
  std::vector<CMU462::Collada::Node,_std::allocator<CMU462::Collada::Node>_>::push_back
            (scene,&local_300);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300.name._M_dataplus._M_p != &local_300.name.field_2) {
    operator_delete(local_300.name._M_dataplus._M_p,local_300.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300.id._M_dataplus._M_p != &local_300.id.field_2) {
    operator_delete(local_300.id._M_dataplus._M_p,local_300.id.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ColladaParser::parse_node( XMLElement* xml ) {

	// create new node
	Node node = Node();

  // name & id
  node.id   = xml->Attribute( "id" );
  node.name = xml->Attribute("name");
  stat(" |- Node: " << node.name << " (id:" << node.id << ")");

	// node transformation -
  // combine in order of declaration if the transformations are given as a
  // transformation list
  XMLElement* e = xml->FirstChildElement();
  while (e) {

    string name = e->Name();

    // transformation - matrix
    if (name == "matrix") {

      string s = e->GetText();
      stringstream ss (s);

      Matrix4x4 mat;
      ss >> mat(0,0); ss >> mat(0,1); ss >> mat(0,2); ss >> mat(0,3);
      ss >> mat(1,0); ss >> mat(1,1); ss >> mat(1,2); ss >> mat(1,3);
      ss >> mat(2,0); ss >> mat(2,1); ss >> mat(2,2); ss >> mat(2,3);
      ss >> mat(3,0); ss >> mat(3,1); ss >> mat(3,2); ss >> mat(3,3);

      node.transform = mat; break;

    }

    // transformation - rotate
    if (name == "rotate") {

      Matrix4x4 m;

      string s = e->GetText();
      stringstream ss (s);

      string sid = e->Attribute("sid");
      switch (sid.back()) {
        case 'X':
          ss >> m(1,1); ss >> m(1,2);
          ss >> m(2,1); ss >> m(2,2);
          break;
        case 'Y':
          ss >> m(0,0); ss >> m(2,0);
          ss >> m(0,2); ss >> m(2,2);
          break;
        case 'Z':
          ss >> m(0,0); ss >> m(0,1);
          ss >> m(1,0); ss >> m(1,1);
          break;
        default:
          break;
      }

      node.transform = m * node.transform;

    }

    // transformation - translate
    if (name == "translate") {

      Matrix4x4 m;

      string s = e->GetText();
      stringstream ss (s);

      ss >> m(0,3); ss >> m(1,3); ss >> m(2,3);

      node.transform = m * node.transform;
    }

    // transformation - scale
    if (name == "scale") {

      Matrix4x4 m;

      string s = e->GetText();
      stringstream ss (s);

      ss >> m(0,0); ss >> m(1,1); ss >> m(1,1);

      node.transform = m * node.transform;
    }

    // transformation - skew
    // Note (sky): ignored for now

    // transformation - lookat
    // Note (sky): ignored for now

    e = e->NextSiblingElement();
  }

	// push transformations
	Matrix4x4 transform_save = transform;

	// combine transformations
	node.transform = transform * node.transform;
	transform = node.transform;

	// parse child nodes if node is a joint
	XMLElement* e_child = get_element(xml, "node");
	while (e_child) {
		parse_node(e_child);
		e_child = e_child->NextSiblingElement("node");
	}

	// pop transformations
	transform = transform_save;

  // node instance -
  // non-joint nodes must contain a scene object instance
  XMLElement* e_camera   = get_element(xml, "instance_camera");
  XMLElement* e_light    = get_element(xml, "instance_light");
	XMLElement* e_geometry = get_element(xml, "instance_geometry");

  if (e_camera) {
    CameraInfo* camera = new CameraInfo();
    parse_camera( e_camera, *camera );
    node.instance = camera;
  } else if (e_light) {
    LightInfo* light = new LightInfo();
    parse_light( e_light, *light );
    node.instance = light;
  } else if (e_geometry) {
		if (get_element(e_geometry, "mesh")) {

			// mesh geometry
			PolymeshInfo* polymesh = new PolymeshInfo();
			parse_polymesh(e_geometry, *polymesh);

			// mesh material
			XMLElement* e_instance_material = get_element(xml,
			"instance_geometry/bind_material/technique_common/instance_material");
			if (e_instance_material) {

				if (!e_instance_material->Attribute("target")) {
					stat("Error: no target material in instance: " << e_instance_material);
					exit(EXIT_FAILURE);
				}

				string material_id = e_instance_material->Attribute("target") + 1;
				XMLElement* e_material = uri_find(material_id);
				if (!e_material) {
					stat("Error: invalid target material id : " << material_id);
					exit(EXIT_FAILURE);
				}

				MaterialInfo* material = new MaterialInfo();
				parse_material(e_material, *material);
				polymesh->material = material;
			}

			node.instance = polymesh;

		} else if (get_element(e_geometry, "extra")) {

			// sphere geometry
			SphereInfo* sphere = new SphereInfo();
			parse_sphere(e_geometry, *sphere);

			// sphere material
			XMLElement* e_instance_material = get_element(xml,
			"instance_geometry/bind_material/technique_common/instance_material");
			if (e_instance_material) {

				if (!e_instance_material->Attribute("target")) {
					stat("Error: no target material in instance: " << e_instance_material);
					exit(EXIT_FAILURE);
				}

				string material_id = e_instance_material->Attribute("target") + 1;
				XMLElement* e_material = uri_find(material_id);
				if (!e_material) {
					stat("Error: invalid target material id : " << material_id);
					exit(EXIT_FAILURE);
				}

				MaterialInfo* material = new MaterialInfo();
				parse_material(e_material, *material);
				sphere->material = material;
			}

			node.instance = sphere;

		}
  }

	// add node to scene
	scene->nodes.push_back(node);
}